

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O1

void sample_output<trng::yarn5>(yarn5 *r,string *name)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  char local_3a [2];
  ulong local_38;
  
  uVar10 = name->_M_string_length;
  while (uVar10 < 0x20) {
    std::__cxx11::string::push_back((char)name);
    uVar10 = name->_M_string_length;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(name->_M_dataplus)._M_p,uVar10);
  iVar11 = 0xf;
  local_38 = 0xfffffffd;
  do {
    iVar1 = (r->S).r[0];
    iVar2 = (r->S).r[1];
    iVar3 = (r->S).r[2];
    iVar4 = (r->S).r[3];
    uVar9 = (long)(r->P).a[3] * (long)iVar4 + (long)(r->P).a[2] * (long)iVar3 +
            (long)(r->P).a[1] * (long)iVar2 + (long)(r->P).a[0] * (long)iVar1;
    uVar10 = uVar9 + 0x80000001fffffffe;
    if (uVar9 < 0x7ffffffe00000002) {
      uVar10 = uVar9;
    }
    uVar10 = (long)(r->S).r[4] * (long)(r->P).a[4] + uVar10;
    (r->S).r[4] = iVar4;
    (r->S).r[3] = iVar3;
    uVar9 = (uVar10 >> 0x1f) + (uVar10 & 0x7fffffff);
    uVar10 = uVar9 - 0x1fffffffc;
    if (uVar9 < 0x1fffffffc) {
      uVar10 = uVar9;
    }
    uVar9 = uVar10 - 0xfffffffe;
    if (uVar10 <= local_38) {
      uVar9 = uVar10;
    }
    (r->S).r[2] = iVar2;
    (r->S).r[1] = iVar1;
    uVar5 = (uint)uVar9 + 0x80000001;
    if (uVar9 < 0x7fffffff) {
      uVar5 = (uint)uVar9;
    }
    (r->S).r[0] = uVar5;
    if (uVar5 == 0) {
      uVar5 = 0;
    }
    else {
      uVar7 = (uint)((ulong)*(uint *)(trng::yarn5::g + (ulong)(uVar5 & 0xffff) * 4) *
                    (ulong)*(uint *)(trng::yarn5::g + (long)((int)uVar5 >> 0x10) * 4 + 0x40000)) &
              0x7fffffff;
      iVar1 = (int)((ulong)*(uint *)(trng::yarn5::g + (ulong)(uVar5 & 0xffff) * 4) *
                    (ulong)*(uint *)(trng::yarn5::g + (long)((int)uVar5 >> 0x10) * 4 + 0x40000) >>
                   0x1f);
      uVar8 = uVar7 + iVar1;
      uVar5 = uVar7 + 0x80000001 + iVar1;
      if (uVar8 < 0x7fffffff) {
        uVar5 = uVar8;
      }
    }
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar5);
    local_3a[0] = '\t';
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_3a,1);
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  iVar11 = (r->S).r[0];
  iVar1 = (r->S).r[1];
  iVar2 = (r->S).r[2];
  iVar3 = (r->S).r[3];
  uVar9 = (long)(r->P).a[3] * (long)iVar3 + (long)(r->P).a[2] * (long)iVar2 +
          (long)(r->P).a[1] * (long)iVar1 + (long)(r->P).a[0] * (long)iVar11;
  uVar10 = uVar9 + 0x80000001fffffffe;
  if (uVar9 < 0x7ffffffe00000002) {
    uVar10 = uVar9;
  }
  uVar10 = (long)(r->S).r[4] * (long)(r->P).a[4] + uVar10;
  (r->S).r[4] = iVar3;
  (r->S).r[3] = iVar2;
  uVar9 = (uVar10 >> 0x1f) + (uVar10 & 0x7fffffff);
  uVar10 = uVar9 - 0x1fffffffc;
  if (uVar9 < 0x1fffffffc) {
    uVar10 = uVar9;
  }
  uVar9 = uVar10 - 0xfffffffe;
  if (uVar10 <= local_38) {
    uVar9 = uVar10;
  }
  (r->S).r[2] = iVar1;
  (r->S).r[1] = iVar11;
  uVar5 = (uint)uVar9 + 0x80000001;
  if (uVar9 < 0x7fffffff) {
    uVar5 = (uint)uVar9;
  }
  (r->S).r[0] = uVar5;
  if (uVar5 == 0) {
    uVar5 = 0;
  }
  else {
    uVar7 = (uint)((ulong)*(uint *)(trng::yarn5::g + (ulong)(uVar5 & 0xffff) * 4) *
                  (ulong)*(uint *)(trng::yarn5::g + (long)((int)uVar5 >> 0x10) * 4 + 0x40000)) &
            0x7fffffff;
    iVar11 = (int)((ulong)*(uint *)(trng::yarn5::g + (ulong)(uVar5 & 0xffff) * 4) *
                   (ulong)*(uint *)(trng::yarn5::g + (long)((int)uVar5 >> 0x10) * 4 + 0x40000) >>
                  0x1f);
    uVar8 = uVar7 + iVar11;
    uVar5 = uVar7 + 0x80000001 + iVar11;
    if (uVar8 < 0x7fffffff) {
      uVar5 = uVar8;
    }
  }
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar5);
  local_3a[1] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_3a + 1,1);
  return;
}

Assistant:

void sample_output(R &r, std::string name) {
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  for (int i{0}; i < 15; ++i)
    std::cout << r() << '\t';
  std::cout << r() << '\n';
}